

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ReleaseMessageTest_Test::TestBody
          (GeneratedMessageReflectionTest_ReleaseMessageTest_Test *this)

{
  Metadata MVar1;
  ReflectionTester reflection_tester;
  TestAllTypes message;
  ReflectionTester RStack_3c8;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0);
  MVar1 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  TestUtil::ReflectionTester::ReflectionTester(&RStack_3c8,MVar1.descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&RStack_3c8,&local_348.super_Message,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&RStack_3c8,&local_348.super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&RStack_3c8,&local_348.super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&RStack_3c8,&local_348.super_Message);
  proto2_unittest::TestAllTypes::Clear(&local_348);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&RStack_3c8,&local_348.super_Message,CAN_BE_NULL);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_348);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ReleaseMessageTest) {
  unittest::TestAllTypes message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(&message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(&message);
  message.Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::CAN_BE_NULL);

  // Test a different code path for setting after releasing.
  TestUtil::SetAllFields(&message);
  TestUtil::ExpectAllFieldsSet(message);
}